

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O1

bool __thiscall
phpconvert::ZendParser::isInMainTypes(ZendParser *this,File *file,PreparedType *preparedType)

{
  iterator iVar1;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&file->mainTypes->_M_t,&preparedType->type);
  return (_Rb_tree_header *)iVar1._M_node != &(file->mainTypes->_M_t)._M_impl.super__Rb_tree_header;
}

Assistant:

bool ZendParser::isInMainTypes(const BaseParser::File &file, const BaseParser::PreparedType &preparedType) const {
        return file.mainTypes->find(preparedType.type)
               != file.mainTypes->end();
    }